

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# demux.c
# Opt level: O0

void InitDemux(WebPDemuxer *dmux,MemBuffer_conflict *mem)

{
  void *in_RSI;
  void *in_RDI;
  
  *(undefined4 *)((long)in_RDI + 0x28) = 0;
  *(undefined4 *)((long)in_RDI + 0x3c) = 1;
  *(undefined4 *)((long)in_RDI + 0x40) = 0xffffffff;
  *(undefined4 *)((long)in_RDI + 0x34) = 0xffffffff;
  *(undefined4 *)((long)in_RDI + 0x38) = 0xffffffff;
  *(long *)((long)in_RDI + 0x50) = (long)in_RDI + 0x48;
  *(long *)((long)in_RDI + 0x60) = (long)in_RDI + 0x58;
  memcpy(in_RDI,in_RSI,0x28);
  return;
}

Assistant:

static void InitDemux(WebPDemuxer* const dmux, const MemBuffer* const mem) {
  dmux->state_ = WEBP_DEMUX_PARSING_HEADER;
  dmux->loop_count_ = 1;
  dmux->bgcolor_ = 0xFFFFFFFF;  // White background by default.
  dmux->canvas_width_ = -1;
  dmux->canvas_height_ = -1;
  dmux->frames_tail_ = &dmux->frames_;
  dmux->chunks_tail_ = &dmux->chunks_;
  dmux->mem_ = *mem;
}